

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeRow(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int n,
           LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *newRow,bool scale)

{
  Item *pIVar1;
  Item *this_00;
  uint *puVar2;
  uint uVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  byte bVar5;
  int *piVar6;
  undefined7 in_register_00000009;
  char *pcVar7;
  ulong uVar8;
  char *__filename;
  long lVar9;
  long lVar10;
  bool bVar11;
  int idx;
  uint local_134;
  undefined4 local_130;
  int local_12c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  soplex local_d8 [8];
  uint auStack_d0 [2];
  uint local_c8 [2];
  uint auStack_c0 [2];
  uint local_b8 [2];
  uint auStack_b0 [2];
  uint local_a8 [2];
  uint auStack_a0 [2];
  int local_98;
  undefined1 local_94;
  fpclass_type local_90;
  int32_t local_8c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_80;
  
  local_130 = (undefined4)CONCAT71(in_register_00000009,scale);
  if (-1 < n) {
    pIVar1 = (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.theitem +
             (this->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thekey[(uint)n].idx;
    lVar9 = (long)(pIVar1->data).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused;
    local_134 = n;
    if (0 < lVar9) {
      do {
        this_00 = (this->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.theitem +
                  (this->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey
                  [(pIVar1->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem[lVar9 + -1].idx].idx;
        pNVar4 = (this_00->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        if ((pNVar4 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0x0) ||
           (pcVar7 = (char *)(long)(this_00->data).
                                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .memused, (long)pcVar7 < 1)) {
LAB_003aca13:
          __filename = (char *)0xffffffff;
        }
        else {
          if (pNVar4->idx == local_134) {
            bVar11 = true;
            __filename = (char *)0x0;
          }
          else {
            __filename = (char *)0x0;
            piVar6 = &pNVar4[1].idx;
            do {
              if (pcVar7 + -1 == __filename) goto LAB_003aca13;
              __filename = __filename + 1;
              uVar3 = *piVar6;
              piVar6 = piVar6 + 0x15;
            } while (uVar3 != local_134);
            bVar11 = __filename < pcVar7;
          }
          if (!bVar11) goto LAB_003aca13;
        }
        if (-1 < (int)__filename) {
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)this_00,__filename);
        }
        bVar11 = 1 < lVar9;
        lVar9 = lVar9 + -1;
      } while (bVar11);
    }
    (pIVar1->data).
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memused = 0;
    local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(newRow->left).m_backend.data._M_elems;
    local_128.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((newRow->left).m_backend.data._M_elems + 2);
    local_128.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((newRow->left).m_backend.data._M_elems + 4);
    local_128.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((newRow->left).m_backend.data._M_elems + 6);
    local_128.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((newRow->left).m_backend.data._M_elems + 8);
    local_128.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((newRow->left).m_backend.data._M_elems + 10);
    local_128.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((newRow->left).m_backend.data._M_elems + 0xc);
    local_128.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((newRow->left).m_backend.data._M_elems + 0xe);
    local_128.m_backend.exp = (newRow->left).m_backend.exp;
    local_128.m_backend.neg = (newRow->left).m_backend.neg;
    local_128.m_backend.fpclass = (newRow->left).m_backend.fpclass;
    local_128.m_backend.prec_elem = (newRow->left).m_backend.prec_elem;
    bVar5 = (byte)local_130;
    uVar8 = (ulong)(byte)local_130;
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x33])(this,(ulong)local_134,&local_128,uVar8);
    local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(newRow->right).m_backend.data._M_elems
    ;
    local_128.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((newRow->right).m_backend.data._M_elems + 2);
    local_128.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((newRow->right).m_backend.data._M_elems + 4);
    local_128.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((newRow->right).m_backend.data._M_elems + 6);
    local_128.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((newRow->right).m_backend.data._M_elems + 8);
    local_128.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((newRow->right).m_backend.data._M_elems + 10);
    local_128.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((newRow->right).m_backend.data._M_elems + 0xc);
    local_128.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((newRow->right).m_backend.data._M_elems + 0xe);
    local_128.m_backend.exp = (newRow->right).m_backend.exp;
    local_128.m_backend.neg = (newRow->right).m_backend.neg;
    local_128.m_backend.fpclass = (newRow->right).m_backend.fpclass;
    local_128.m_backend.prec_elem = (newRow->right).m_backend.prec_elem;
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x36])(this,(ulong)local_134,&local_128,(ulong)bVar5);
    local_128.m_backend.data._M_elems._0_8_ =
         *(undefined8 *)(newRow->object).m_backend.data._M_elems;
    local_128.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((newRow->object).m_backend.data._M_elems + 2);
    local_128.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((newRow->object).m_backend.data._M_elems + 4);
    local_128.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((newRow->object).m_backend.data._M_elems + 6);
    local_128.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((newRow->object).m_backend.data._M_elems + 8);
    local_128.m_backend.data._M_elems._40_8_ =
         *(undefined8 *)((newRow->object).m_backend.data._M_elems + 10);
    local_128.m_backend.data._M_elems._48_8_ =
         *(undefined8 *)((newRow->object).m_backend.data._M_elems + 0xc);
    local_128.m_backend.data._M_elems._56_8_ =
         *(undefined8 *)((newRow->object).m_backend.data._M_elems + 0xe);
    local_128.m_backend.exp = (newRow->object).m_backend.exp;
    local_128.m_backend.neg = (newRow->object).m_backend.neg;
    local_128.m_backend.fpclass = (newRow->object).m_backend.fpclass;
    local_128.m_backend.prec_elem = (newRow->object).m_backend.prec_elem;
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x3c])(this,(ulong)local_134,&local_128,uVar8);
    lVar9 = (long)(newRow->vec).
                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .memused;
    if (0 < lVar9) {
      lVar10 = lVar9 + 1;
      lVar9 = lVar9 * 0x54 + -4;
      do {
        pNVar4 = (newRow->vec).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        local_12c = *(int *)((long)(pNVar4->val).m_backend.data._M_elems + lVar9);
        puVar2 = (uint *)((long)(&pNVar4->val + -1) + lVar9);
        local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
        local_128.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = (uint *)((long)(&(pNVar4->val).m_backend.data + -1) + lVar9);
        local_128.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        local_128.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = (uint *)((long)(pNVar4->val).m_backend.data._M_elems + lVar9 + -0x30);
        local_128.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
        local_128.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
        puVar2 = (uint *)((long)(pNVar4->val).m_backend.data._M_elems + lVar9 + -0x20);
        local_128.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
        local_128.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
        local_128.m_backend.exp =
             *(int *)((long)(pNVar4->val).m_backend.data._M_elems + lVar9 + -0x10);
        local_128.m_backend.neg =
             *(bool *)((long)(pNVar4->val).m_backend.data._M_elems + lVar9 + -0xc);
        local_128.m_backend.fpclass =
             *(fpclass_type *)((long)(pNVar4->val).m_backend.data._M_elems + lVar9 + -8);
        local_128.m_backend.prec_elem =
             *(int32_t *)((long)(pNVar4->val).m_backend.data._M_elems + lVar9 + -4);
        if ((byte)local_130 != '\0') {
          local_d8 = (soplex  [8])local_128.m_backend.data._M_elems._0_8_;
          auStack_d0 = (uint  [2])local_128.m_backend.data._M_elems._8_8_;
          local_c8 = (uint  [2])local_128.m_backend.data._M_elems._16_8_;
          auStack_c0 = (uint  [2])local_128.m_backend.data._M_elems._24_8_;
          local_b8 = (uint  [2])local_128.m_backend.data._M_elems._32_8_;
          auStack_b0 = (uint  [2])local_128.m_backend.data._M_elems._40_8_;
          local_a8 = (uint  [2])local_128.m_backend.data._M_elems._48_8_;
          auStack_a0 = (uint  [2])local_128.m_backend.data._M_elems._56_8_;
          local_98 = local_128.m_backend.exp;
          local_94 = local_128.m_backend.neg;
          local_90 = local_128.m_backend.fpclass;
          local_8c = local_128.m_backend.prec_elem;
          spxLdexp<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>
                    (&local_80,local_d8,
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)(ulong)(uint)((this->
                                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).scaleExp.data[local_12c] +
                                     (this->
                                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                     ).scaleExp.data[(int)local_134]),local_134);
          local_128.m_backend.data._M_elems[0xc] = local_80.m_backend.data._M_elems[0xc];
          local_128.m_backend.data._M_elems[0xd] = local_80.m_backend.data._M_elems[0xd];
          local_128.m_backend.data._M_elems[0xe] = local_80.m_backend.data._M_elems[0xe];
          local_128.m_backend.data._M_elems[0xf] = local_80.m_backend.data._M_elems[0xf];
          local_128.m_backend.data._M_elems[8] = local_80.m_backend.data._M_elems[8];
          local_128.m_backend.data._M_elems[9] = local_80.m_backend.data._M_elems[9];
          local_128.m_backend.data._M_elems[10] = local_80.m_backend.data._M_elems[10];
          local_128.m_backend.data._M_elems[0xb] = local_80.m_backend.data._M_elems[0xb];
          local_128.m_backend.data._M_elems[4] = local_80.m_backend.data._M_elems[4];
          local_128.m_backend.data._M_elems[5] = local_80.m_backend.data._M_elems[5];
          local_128.m_backend.data._M_elems[6] = local_80.m_backend.data._M_elems[6];
          local_128.m_backend.data._M_elems[7] = local_80.m_backend.data._M_elems[7];
          local_128.m_backend.data._M_elems[0] = local_80.m_backend.data._M_elems[0];
          local_128.m_backend.data._M_elems[1] = local_80.m_backend.data._M_elems[1];
          local_128.m_backend.data._M_elems[2] = local_80.m_backend.data._M_elems[2];
          local_128.m_backend.data._M_elems[3] = local_80.m_backend.data._M_elems[3];
          local_128.m_backend.exp = local_80.m_backend.exp;
          local_128.m_backend.neg = local_80.m_backend.neg;
          local_128.m_backend.fpclass = local_80.m_backend.fpclass;
          local_128.m_backend.prec_elem = local_80.m_backend.prec_elem;
        }
        LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add2(&this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,local_134,1,&local_12c,&local_128);
        LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add2(&this->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,local_12c,1,(int *)&local_134,&local_128);
        lVar10 = lVar10 + -1;
        lVar9 = lVar9 + -0x54;
      } while (1 < lVar10);
    }
  }
  return;
}

Assistant:

virtual void changeRow(int n, const LPRowBase<R>& newRow, bool scale = false)
   {
      if(n < 0)
         return;

      int j;
      SVectorBase<R>& row = rowVector_w(n);

      for(j = row.size() - 1; j >= 0; --j)
      {
         SVectorBase<R>& col = colVector_w(row.index(j));
         int position = col.pos(n);

         assert(position != -1);

         if(position >= 0)
            col.remove(position);
      }

      row.clear();

      changeLhs(n, newRow.lhs(), scale);
      changeRhs(n, newRow.rhs(), scale);
      changeRowObj(n, newRow.obj(), scale);

      const SVectorBase<R>& newrow = newRow.rowVector();

      for(j = newrow.size() - 1; j >= 0; --j)
      {
         int idx = newrow.index(j);
         R val = newrow.value(j);

         if(scale)
            val = spxLdexp(val, LPRowSetBase<R>::scaleExp[n] + LPColSetBase<R>::scaleExp[idx]);

         LPRowSetBase<R>::add2(n, 1, &idx, &val);
         LPColSetBase<R>::add2(idx, 1, &n, &val);
      }

      assert(isConsistent());
   }